

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

bool __thiscall PcodeOp::isCseMatch(PcodeOp *this,PcodeOp *op)

{
  bool bVar1;
  uint4 uVar2;
  int4 iVar3;
  int4 iVar4;
  OpCode OVar5;
  OpCode OVar6;
  size_type sVar7;
  size_type sVar8;
  Varnode *this_00;
  Varnode *this_01;
  uintb uVar9;
  uintb uVar10;
  Varnode *vn2;
  Varnode *vn1;
  int4 i;
  PcodeOp *op_local;
  PcodeOp *this_local;
  
  uVar2 = getEvalType(this);
  if ((uVar2 & 0x18000) == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = getEvalType(op);
    if ((uVar2 & 0x18000) == 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = Varnode::getSize(this->output);
      iVar4 = Varnode::getSize(op->output);
      if (iVar3 == iVar4) {
        OVar5 = code(this);
        OVar6 = code(op);
        if (OVar5 == OVar6) {
          OVar5 = code(this);
          if (OVar5 == CPUI_COPY) {
            this_local._7_1_ = false;
          }
          else {
            sVar7 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inrefs);
            sVar8 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&op->inrefs);
            if (sVar7 == sVar8) {
              for (vn1._4_4_ = 0;
                  sVar7 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inrefs),
                  (ulong)(long)vn1._4_4_ < sVar7; vn1._4_4_ = vn1._4_4_ + 1) {
                this_00 = getIn(this,vn1._4_4_);
                this_01 = getIn(op,vn1._4_4_);
                if (this_00 != this_01) {
                  bVar1 = Varnode::isConstant(this_00);
                  if ((!bVar1) || (bVar1 = Varnode::isConstant(this_01), !bVar1)) {
                    return false;
                  }
                  uVar9 = Varnode::getOffset(this_00);
                  uVar10 = Varnode::getOffset(this_01);
                  if (uVar9 != uVar10) {
                    return false;
                  }
                }
              }
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PcodeOp::isCseMatch(const PcodeOp *op) const

{
  if ((getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return false;
  if ((op->getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return false;
  if (output->getSize() != op->output->getSize()) return false;
  if (code() != op->code()) return false;
  if (code() == CPUI_COPY) return false; // Let copy propagation deal with this
  if (inrefs.size() != op->inrefs.size()) return false;
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn1 = getIn(i);
    const Varnode *vn2 = op->getIn(i);
    if (vn1 == vn2) continue;
    if (vn1->isConstant()&&vn2->isConstant()&&(vn1->getOffset()==vn2->getOffset()))
      continue;
    return false;
  }
  return true;
}